

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

int __thiscall
ot::commissioner::UdpSocket::Bind(UdpSocket *this,string *aLocalAddr,uint16_t aLocalPort)

{
  char *bind_ip;
  char *port;
  int local_50;
  int rval;
  undefined1 local_40 [8];
  string portStr;
  uint16_t aLocalPort_local;
  string *aLocalAddr_local;
  UdpSocket *this_local;
  
  portStr.field_2._14_2_ = aLocalPort;
  std::__cxx11::to_string((string *)local_40,(uint)aLocalPort);
  mbedtls_net_free((mbedtls_net_context *)&(this->super_Socket).field_0xb4);
  if ((this->super_Socket).mEvent.ev_base != (event_base *)0x0) {
    event_del(&(this->super_Socket).mEvent);
  }
  bind_ip = (char *)std::__cxx11::string::c_str();
  port = (char *)std::__cxx11::string::c_str();
  local_50 = mbedtls_net_bind((mbedtls_net_context *)&(this->super_Socket).field_0xb4,bind_ip,port,1
                             );
  if (((local_50 == 0) &&
      (local_50 = mbedtls_net_set_nonblock((mbedtls_net_context *)&(this->super_Socket).field_0xb4),
      local_50 == 0)) &&
     (local_50 = event_assign(&(this->super_Socket).mEvent,(this->super_Socket).mEventBase,
                              *(int *)&(this->super_Socket).field_0xb4,0x36,Socket::HandleEvent,this
                             ), local_50 == 0)) {
    local_50 = event_add(&(this->super_Socket).mEvent,(timeval *)0x0);
  }
  if (local_50 == 0) {
    this->mIsBound = true;
  }
  else {
    mbedtls_net_free((mbedtls_net_context *)&(this->super_Socket).field_0xb4);
  }
  std::__cxx11::string::~string((string *)local_40);
  return local_50;
}

Assistant:

int UdpSocket::Bind(const std::string &aLocalAddr, uint16_t aLocalPort)
{
    auto portStr = std::to_string(aLocalPort);

    // Free the fd if already opened.
    mbedtls_net_free(&mNetCtx);
    if (mEvent.ev_base != nullptr)
    {
        event_del(&mEvent);
    }

    // Bind
    int rval = mbedtls_net_bind(&mNetCtx, aLocalAddr.c_str(), portStr.c_str(), MBEDTLS_NET_PROTO_UDP);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = mbedtls_net_set_nonblock(&mNetCtx)) == 0);

    // Setup Event
    rval = event_assign(&mEvent, mEventBase, mNetCtx.fd, EV_PERSIST | EV_READ | EV_WRITE | EV_ET, HandleEvent, this);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = event_add(&mEvent, nullptr)) == 0);

exit:
    if (rval != 0)
    {
        mbedtls_net_free(&mNetCtx);
    }
    else
    {
        mIsBound = true;
    }
    return rval;
}